

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions2.cpp
# Opt level: O3

void __thiscall converterApp_fileConversions_Test::TestBody(converterApp_fileConversions_Test *this)

{
  _Alloc_hider _Var1;
  pointer pcVar2;
  size_type sVar3;
  pointer pcVar4;
  ParamType *pPVar5;
  uint64_t uVar6;
  char *pcVar7;
  char *in_R9;
  pointer pcVar8;
  bool bVar9;
  double dVar10;
  precise_unit unit_short;
  string testFile;
  precise_unit unit;
  precise_unit baseUnit;
  char *in_stack_fffffffffffffeb8;
  precise_unit local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_138;
  internal local_130;
  undefined7 uStack_12f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  char local_120;
  undefined7 uStack_11f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  AssertHelper local_100;
  string local_f8;
  converterApp *local_d8;
  double local_d0;
  string local_c8;
  string local_a8;
  precise_unit local_88;
  pointer local_78;
  double local_70;
  AssertHelper local_68;
  precise_unit local_60;
  string local_50;
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_d8 = &this->super_converterApp;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/test_conversions/"
             ,"");
  pPVar5 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam();
  std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(pPVar5->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_f8);
  converterApp::loadFile(local_d8,&local_f8);
  pcVar8 = (local_d8->unit_conv).super__Vector_base<convValue,_std::allocator<convValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  _Var1._M_p = (pcVar8->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,_Var1._M_p,_Var1._M_p + (pcVar8->name)._M_string_length);
  uVar6 = units::getDefaultFlags();
  local_60 = units::unit_from_string(&local_50,uVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar8 = (local_d8->unit_conv).super__Vector_base<convValue,_std::allocator<convValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78 = (local_d8->unit_conv).super__Vector_base<convValue,_std::allocator<convValue>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (pcVar8 != local_78) {
    local_d0 = pcVar8->value;
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      pcVar2 = (pcVar8->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + (pcVar8->name)._M_string_length);
      uVar6 = units::getDefaultFlags();
      local_88 = units::unit_from_string(&local_a8,uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      bVar9 = local_88.base_units_ != -0x56b5b78;
      local_140.multiplier_._0_1_ = bVar9 && !NAN(local_88.multiplier_);
      pbStack_138._0_4_ = (unit_data)0x0;
      pbStack_138._4_4_ = 0;
      if (!bVar9 || NAN(local_88.multiplier_)) {
        testing::Message::Message((Message *)&local_130);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(uStack_12f,local_130) + 0x10),"error converting ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(uStack_12f,local_130) + 0x10),
                   (pcVar8->name)._M_dataplus._M_p,(pcVar8->name)._M_string_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_120,(internal *)&stack0xfffffffffffffec0,
                   (AssertionResult *)"is_error(unit)","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                   ,0x45,(char *)CONCAT71(uStack_11f,local_120));
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_130);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if ((undefined1 *)CONCAT71(uStack_11f,local_120) != &stack0xfffffffffffffef0) {
          operator_delete((undefined1 *)CONCAT71(uStack_11f,local_120),in_stack_fffffffffffffef0 + 1
                         );
        }
        if ((long *)CONCAT71(uStack_12f,local_130) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(uStack_12f,local_130) + 8))();
        }
        if (pbStack_138 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_138,pbStack_138);
        }
      }
      sVar3 = (pcVar8->short_name)._M_string_length;
      if (sVar3 == 0) {
LAB_001284a0:
        local_70 = units::convert<units::precise_unit,units::precise_unit>
                             (local_d0,&local_60,&local_88);
        testing::internal::DoubleNearPredFormat
                  ((char *)local_140.multiplier_,in_stack_fffffffffffffeb8,
                   (char *)in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffef8,
                   (double)in_stack_fffffffffffffef0,(double)in_stack_fffffffffffffee8);
        if (local_120 == '\0') {
          testing::Message::Message((Message *)&stack0xfffffffffffffec0);
          pcVar4 = (local_d8->unit_conv).super__Vector_base<convValue,_std::allocator<convValue>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140.multiplier_ + 0x10),(pcVar4->name)._M_dataplus._M_p
                     ,(pcVar4->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140.multiplier_ + 0x10)," to ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140.multiplier_ + 0x10),(pcVar8->name)._M_dataplus._M_p
                     ,(pcVar8->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140.multiplier_ + 0x10)," produced ",10);
          std::ostream::_M_insert<double>(local_70);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140.multiplier_ + 0x10)," when ",6);
          std::ostream::_M_insert<double>(pcVar8->value);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_140.multiplier_ + 0x10)," expected",9);
          pcVar7 = "";
          if (in_stack_fffffffffffffee8 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = (in_stack_fffffffffffffee8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                     ,0x58,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_130,(Message *)&stack0xfffffffffffffec0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
          if (local_140.multiplier_ !=
              (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_140.multiplier_ + 8))();
          }
        }
        if (in_stack_fffffffffffffee8 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xfffffffffffffee8,in_stack_fffffffffffffee8);
        }
        units::convert<units::precise_unit,units::precise_unit>(pcVar8->value,&local_88,&local_60);
        testing::internal::DoubleNearPredFormat
                  ((char *)local_140.multiplier_,in_stack_fffffffffffffeb8,
                   (char *)in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffef8,
                   (double)in_stack_fffffffffffffef0,(double)in_stack_fffffffffffffee8);
        if (local_120 == '\0') {
          testing::Message::Message((Message *)&stack0xfffffffffffffec0);
          pcVar7 = "";
          if (in_stack_fffffffffffffee8 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = (in_stack_fffffffffffffee8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                     ,0x5c,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_130,(Message *)&stack0xfffffffffffffec0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
          if (local_140.multiplier_ !=
              (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_140.multiplier_ + 8))();
          }
        }
        if (in_stack_fffffffffffffee8 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xfffffffffffffee8,in_stack_fffffffffffffee8);
        }
      }
      else {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        pcVar2 = (pcVar8->short_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>((string *)&local_c8,pcVar2,pcVar2 + sVar3);
        uVar6 = units::getDefaultFlags();
        local_140 = units::unit_from_string(&local_c8,uVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        bVar9 = local_140.base_units_ != -0x56b5b78;
        local_130 = (internal)(bVar9 && !NAN(local_140.multiplier_));
        in_stack_fffffffffffffed8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar9 || NAN(local_140.multiplier_)) {
          testing::Message::Message((Message *)&local_100);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_100.data_)->line,"error converting ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_100.data_)->line,(pcVar8->short_name)._M_dataplus._M_p,
                     (pcVar8->short_name)._M_string_length);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_120,&local_130,(AssertionResult *)"is_error(unit_short)",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                     ,0x48,(char *)CONCAT71(uStack_11f,local_120));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_100);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((undefined1 *)CONCAT71(uStack_11f,local_120) != &stack0xfffffffffffffef0) {
            operator_delete((undefined1 *)CONCAT71(uStack_11f,local_120),
                            in_stack_fffffffffffffef0 + 1);
          }
          if (local_100.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_100.data_ + 8))();
          }
          if (in_stack_fffffffffffffed8 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&stack0xfffffffffffffed8,in_stack_fffffffffffffed8);
          }
        }
        bVar9 = units::precise_unit::operator==(&local_88,&stack0xfffffffffffffec0);
        if (bVar9) {
          testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
                    ((internal *)&local_120,"unit","unit_short",&local_88,&stack0xfffffffffffffec0);
          if (local_120 == '\0') {
            testing::Message::Message((Message *)&local_130);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT71(uStack_12f,local_130) + 0x10),
                       (pcVar8->name)._M_dataplus._M_p,(pcVar8->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT71(uStack_12f,local_130) + 0x10)," and ",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT71(uStack_12f,local_130) + 0x10),
                       (pcVar8->short_name)._M_dataplus._M_p,(pcVar8->short_name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT71(uStack_12f,local_130) + 0x10),
                       " do not produce the same unit",0x1d);
            pcVar7 = "";
            if (in_stack_fffffffffffffee8 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar7 = (in_stack_fffffffffffffee8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                       ,0x52,pcVar7);
            testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_130);
LAB_00128474:
            testing::internal::AssertHelper::~AssertHelper(&local_100);
            if ((long *)CONCAT71(uStack_12f,local_130) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(uStack_12f,local_130) + 8))();
            }
          }
LAB_0012848c:
          if (in_stack_fffffffffffffee8 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&stack0xfffffffffffffee8,in_stack_fffffffffffffee8);
          }
          goto LAB_001284a0;
        }
        bVar9 = units::precise_unit::operator==(&local_88,(precise_unit *)units::precise::log::bel);
        if (!bVar9) {
          dVar10 = units::convert<units::precise_unit,units::precise_unit>
                             (1.0,&local_88,&stack0xfffffffffffffec0);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&local_120,"convert(1.0, unit, unit_short)","1.0F",(float)dVar10,
                     1.0);
          if (local_120 == '\0') {
            testing::Message::Message((Message *)&local_130);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT71(uStack_12f,local_130) + 0x10),
                       (pcVar8->short_name)._M_dataplus._M_p,(pcVar8->short_name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT71(uStack_12f,local_130) + 0x10)," and ",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT71(uStack_12f,local_130) + 0x10),
                       (pcVar8->name)._M_dataplus._M_p,(pcVar8->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(CONCAT71(uStack_12f,local_130) + 0x10)," do not match",0xd);
            pcVar7 = "";
            if (in_stack_fffffffffffffee8 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar7 = (in_stack_fffffffffffffee8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                       ,0x4e,pcVar7);
            testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_130);
            goto LAB_00128474;
          }
          goto LAB_0012848c;
        }
      }
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 != local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_P(converterApp, fileConversions)
{
    std::string testFile = TEST_FILE_FOLDER "/test_conversions/";
    testFile.append(GetParam());
    testFile.append("_conversions.txt");
    loadFile(testFile);
    auto baseUnit = units::unit_from_string(unit_conv[0].name);
    double baseValue = unit_conv[0].value;
    for (auto& convcode : unit_conv) {
        auto unit = units::unit_from_string(convcode.name);
        EXPECT_FALSE(is_error(unit)) << "error converting " << convcode.name;
        if (!convcode.short_name.empty()) {
            auto unit_short = units::unit_from_string(convcode.short_name);
            EXPECT_FALSE(is_error(unit_short))
                << "error converting " << convcode.short_name;
            if (unit != unit_short) {
                if (unit == units::precise::log::bel) {
                    continue;  // this is a known choice to match SI
                }
                EXPECT_FLOAT_EQ(convert(1.0, unit, unit_short), 1.0F)
                    << convcode.short_name << " and " << convcode.name
                    << " do not match";
            } else {
                EXPECT_EQ(unit, unit_short)
                    << convcode.name << " and " << convcode.short_name
                    << " do not produce the same unit";
            }
        }
        double res = units::convert(baseValue, baseUnit, unit);
        EXPECT_NEAR(res / convcode.value, 1.0, 0.003)
            << unit_conv[0].name << " to " << convcode.name << " produced "
            << res << " when " << convcode.value << " expected";
        double return_value = units::convert(convcode.value, unit, baseUnit);
        EXPECT_NEAR(return_value / baseValue, 1.0, 0.003);
    }
}